

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkreplyhttpimpl_p.cpp
# Opt level: O0

int __thiscall
QNetworkReplyHttpImpl::qt_metacall(QNetworkReplyHttpImpl *this,Call _c,int _id,void **_a)

{
  undefined8 in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  void **in_RDI;
  void **in_stack_00000058;
  int in_stack_00000060;
  Call in_stack_00000064;
  QObject *in_stack_00000068;
  undefined4 local_4;
  
  local_4 = QNetworkReply::qt_metacall
                      ((QNetworkReply *)CONCAT44(in_ESI,in_EDX),(Call)((ulong)in_RCX >> 0x20),
                       (int)in_RCX,in_RDI);
  if (-1 < local_4) {
    if (in_ESI == 0) {
      if (local_4 < 0x20) {
        qt_static_metacall(in_stack_00000068,in_stack_00000064,in_stack_00000060,in_stack_00000058);
      }
      local_4 = local_4 + -0x20;
    }
    if (in_ESI == 7) {
      if (local_4 < 0x20) {
        qt_static_metacall(in_stack_00000068,in_stack_00000064,in_stack_00000060,in_stack_00000058);
      }
      local_4 = local_4 + -0x20;
    }
  }
  return local_4;
}

Assistant:

int QNetworkReplyHttpImpl::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QNetworkReply::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 32)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 32;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 32)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 32;
    }
    return _id;
}